

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_FakeIDsForTickets_Test::
~SSLVersionTest_FakeIDsForTickets_Test(SSLVersionTest_FakeIDsForTickets_Test *this)

{
  anon_unknown_0::SSLVersionTest_FakeIDsForTickets_Test::~SSLVersionTest_FakeIDsForTickets_Test
            ((SSLVersionTest_FakeIDsForTickets_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(SSLVersionTest, FakeIDsForTickets) {
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);

  EXPECT_TRUE(SSL_SESSION_has_ticket(session.get()));
  unsigned session_id_length;
  SSL_SESSION_get_id(session.get(), &session_id_length);
  EXPECT_NE(session_id_length, 0u);
}